

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_199c2b::ProducedDirectoryNodeTask::inputsAvailable
          (ProducedDirectoryNodeTask *this,TaskInterface ti)

{
  void *pvVar1;
  BuildEngineDelegate *pBVar2;
  TaskInterface local_a0;
  ValueType local_90;
  BuildValue local_78;
  
  local_a0.ctx = ti.ctx;
  local_a0.impl = ti.impl;
  if (this->returnDirectorySignature == true) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,
               &this->directorySignature);
  }
  else {
    if (this->isInvalid == true) {
      local_78.kind = (Kind)ti.impl;
      local_78.numOutputInfos = ti.impl._4_4_;
      local_78.signature.value._0_4_ = ti.ctx._0_4_;
      local_78.signature.value._4_4_ = ti.ctx._4_4_;
      pBVar2 = llbuild::core::TaskInterface::delegate((TaskInterface *)&local_78);
      (**(code **)(*(long *)pBVar2[1]._vptr_BuildEngineDelegate[1] + 0x30))();
      local_78.kind = FailedInput;
      local_78.numOutputInfos = 0;
      local_78.signature.value._0_4_ = 0;
      local_78.signature.value._4_4_ = 0;
      local_78.valueData.asOutputInfo.device._0_4_ = 0;
      local_78.valueData.asOutputInfo.device._4_4_ = 0;
      local_78.valueData.asOutputInfo.inode._0_4_ = 0;
      local_78.valueData._12_8_ = 0;
      local_78.valueData._20_8_ = 0;
      local_78.valueData._28_8_ = 0;
      local_78.valueData._36_8_ = 0;
      local_78.valueData._44_8_ = 0;
      local_78.valueData._52_8_ = 0;
      local_78.valueData._60_8_ = 0;
      local_78.valueData._68_8_ = 0;
      local_78.valueData._76_4_ = 0;
      local_78.stringValues.contents._0_4_ = 0;
      local_78.stringValues.contents._4_4_ = 0;
      local_78.stringValues.size = 0;
      llbuild::buildsystem::BuildValue::toData(&local_90,&local_78);
      llbuild::core::TaskInterface::complete(&local_a0,&local_90,false);
      if (local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_90.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      llbuild::buildsystem::BuildValue::~BuildValue(&local_78);
      return;
    }
    if ((this->nodeResult).kind == Invalid) {
      __assert_fail("!nodeResult.isInvalid()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                    ,0x37f,
                    "virtual void (anonymous namespace)::ProducedDirectoryNodeTask::inputsAvailable(TaskInterface)"
                   );
    }
    llbuild::buildsystem::BuildValue::toData((ValueType *)&local_78,&this->nodeResult);
  }
  llbuild::core::TaskInterface::complete(&local_a0,(ValueType *)&local_78,false);
  pvVar1 = (void *)CONCAT44(local_78.numOutputInfos,local_78.kind);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,CONCAT44(local_78.valueData.asOutputInfo.device._4_4_,
                                    local_78.valueData.asOutputInfo.device._0_4_) - (long)pvVar1);
  }
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    if (returnDirectorySignature) {
      ti.complete(ValueType(directorySignature));
      return;
    } else {
      if (isInvalid) {
        getBuildSystem(ti).getDelegate().hadCommandFailure();
        ti.complete(BuildValue::makeFailedInput().toData());
        return;
      }
      assert(!nodeResult.isInvalid());
      
      // Complete the task immediately.
      ti.complete(nodeResult.toData());
    }
  }